

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

int mz_inflateReset(mz_streamp pStream)

{
  mz_internal_state *pmVar1;
  inflate_state *pDecomp;
  mz_streamp pStream_local;
  
  if (pStream == (mz_streamp)0x0) {
    pStream_local._4_4_ = -2;
  }
  else {
    pStream->data_type = 0;
    pStream->adler = 0;
    pStream->msg = (char *)0x0;
    pStream->total_in = 0;
    pStream->total_out = 0;
    pStream->reserved = 0;
    pmVar1 = pStream->state;
    *(undefined4 *)pmVar1 = 0;
    *(undefined4 *)(pmVar1 + 11000) = 0;
    *(undefined4 *)(pmVar1 + 0x2afc) = 0;
    *(undefined4 *)(pmVar1 + 0xab0c) = 1;
    *(undefined4 *)(pmVar1 + 0x2b00) = 1;
    *(undefined4 *)(pmVar1 + 0x2b04) = 0;
    pStream_local._4_4_ = 0;
  }
  return pStream_local._4_4_;
}

Assistant:

int mz_inflateReset(mz_streamp pStream)
{
    inflate_state *pDecomp;
    if (!pStream)
        return MZ_STREAM_ERROR;

    pStream->data_type = 0;
    pStream->adler = 0;
    pStream->msg = NULL;
    pStream->total_in = 0;
    pStream->total_out = 0;
    pStream->reserved = 0;

    pDecomp = (inflate_state *)pStream->state;

    tinfl_init(&pDecomp->m_decomp);
    pDecomp->m_dict_ofs = 0;
    pDecomp->m_dict_avail = 0;
    pDecomp->m_last_status = TINFL_STATUS_NEEDS_MORE_INPUT;
    pDecomp->m_first_call = 1;
    pDecomp->m_has_flushed = 0;
    /* pDecomp->m_window_bits = window_bits */;

    return MZ_OK;
}